

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O1

int __thiscall ncnn::Gemm::load_model(Gemm *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  void *local_68;
  int *piStack_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  int local_30;
  size_t local_28;
  
  if (this->constantA == 1) {
    pMVar1 = &this->A_data;
    if (this->transA == 0) {
      (*mb->_vptr_ModelBin[3])
                (&local_68,mb,(ulong)(uint)this->constantK,(ulong)(uint)this->constantM,0);
      if (pMVar1 != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar2 = (this->A_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->A_data).data;
            pAVar4 = (this->A_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->A_data).cstep = 0;
        *(undefined8 *)((long)&(this->A_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->A_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->A_data).refcount = (int *)0x0;
        (this->A_data).dims = 0;
        (this->A_data).w = 0;
        (this->A_data).h = 0;
        (this->A_data).d = 0;
        (this->A_data).c = 0;
        (this->A_data).data = local_68;
        (this->A_data).refcount = piStack_60;
        (this->A_data).elemsize = local_58;
        (this->A_data).elempack = local_50;
        (this->A_data).allocator = local_48;
        (this->A_data).dims = local_40;
        (this->A_data).w = iStack_3c;
        (this->A_data).h = iStack_38;
        (this->A_data).d = iStack_34;
        (this->A_data).c = local_30;
        (this->A_data).cstep = local_28;
      }
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + -1;
        UNLOCK();
        if (*piStack_60 == 0) {
          if (local_48 == (Allocator *)0x0) goto LAB_004d63b8;
          (*local_48->_vptr_Allocator[3])();
        }
      }
    }
    else {
      (*mb->_vptr_ModelBin[3])
                (&local_68,mb,(ulong)(uint)this->constantM,(ulong)(uint)this->constantK,0);
      if (pMVar1 != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar2 = (this->A_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->A_data).data;
            pAVar4 = (this->A_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->A_data).cstep = 0;
        *(undefined8 *)((long)&(this->A_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->A_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->A_data).refcount = (int *)0x0;
        (this->A_data).dims = 0;
        (this->A_data).w = 0;
        (this->A_data).h = 0;
        (this->A_data).d = 0;
        (this->A_data).c = 0;
        (this->A_data).data = local_68;
        (this->A_data).refcount = piStack_60;
        (this->A_data).elemsize = local_58;
        (this->A_data).elempack = local_50;
        (this->A_data).allocator = local_48;
        (this->A_data).dims = local_40;
        (this->A_data).w = iStack_3c;
        (this->A_data).h = iStack_38;
        (this->A_data).d = iStack_34;
        (this->A_data).c = local_30;
        (this->A_data).cstep = local_28;
      }
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + -1;
        UNLOCK();
        if (*piStack_60 == 0) {
          if (local_48 == (Allocator *)0x0) {
LAB_004d63b8:
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((this->A_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->A_data).c * (this->A_data).cstep == 0) {
      return -100;
    }
  }
  if (this->constantB != 1) goto LAB_004d6681;
  pMVar1 = &this->B_data;
  if (this->transB == 0) {
    (*mb->_vptr_ModelBin[3])
              (&local_68,mb,(ulong)(uint)this->constantN,(ulong)(uint)this->constantK,0);
    if (pMVar1 != (Mat *)&local_68) {
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + 1;
        UNLOCK();
      }
      piVar2 = (this->B_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->B_data).data;
          pAVar4 = (this->B_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->B_data).cstep = 0;
      *(undefined8 *)((long)&(this->B_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->B_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->B_data).refcount = (int *)0x0;
      (this->B_data).dims = 0;
      (this->B_data).w = 0;
      (this->B_data).h = 0;
      (this->B_data).d = 0;
      (this->B_data).c = 0;
      (this->B_data).data = local_68;
      (this->B_data).refcount = piStack_60;
      (this->B_data).elemsize = local_58;
      (this->B_data).elempack = local_50;
      (this->B_data).allocator = local_48;
      (this->B_data).dims = local_40;
      (this->B_data).w = iStack_3c;
      (this->B_data).h = iStack_38;
      (this->B_data).d = iStack_34;
      (this->B_data).c = local_30;
      (this->B_data).cstep = local_28;
    }
    if (piStack_60 != (int *)0x0) {
      LOCK();
      *piStack_60 = *piStack_60 + -1;
      UNLOCK();
      if (*piStack_60 == 0) {
        if (local_48 == (Allocator *)0x0) goto LAB_004d6649;
        (*local_48->_vptr_Allocator[3])();
      }
    }
  }
  else {
    (*mb->_vptr_ModelBin[3])
              (&local_68,mb,(ulong)(uint)this->constantK,(ulong)(uint)this->constantN,0);
    if (pMVar1 != (Mat *)&local_68) {
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + 1;
        UNLOCK();
      }
      piVar2 = (this->B_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->B_data).data;
          pAVar4 = (this->B_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->B_data).cstep = 0;
      *(undefined8 *)((long)&(this->B_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->B_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->B_data).refcount = (int *)0x0;
      (this->B_data).dims = 0;
      (this->B_data).w = 0;
      (this->B_data).h = 0;
      (this->B_data).d = 0;
      (this->B_data).c = 0;
      (this->B_data).data = local_68;
      (this->B_data).refcount = piStack_60;
      (this->B_data).elemsize = local_58;
      (this->B_data).elempack = local_50;
      (this->B_data).allocator = local_48;
      (this->B_data).dims = local_40;
      (this->B_data).w = iStack_3c;
      (this->B_data).h = iStack_38;
      (this->B_data).d = iStack_34;
      (this->B_data).c = local_30;
      (this->B_data).cstep = local_28;
    }
    if (piStack_60 != (int *)0x0) {
      LOCK();
      *piStack_60 = *piStack_60 + -1;
      UNLOCK();
      if (*piStack_60 == 0) {
        if (local_48 == (Allocator *)0x0) {
LAB_004d6649:
          if (local_68 != (void *)0x0) {
            free(local_68);
          }
        }
        else {
          (*local_48->_vptr_Allocator[3])();
        }
      }
    }
  }
  if ((this->B_data).data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->B_data).c * (this->B_data).cstep == 0) {
    return -100;
  }
LAB_004d6681:
  if ((this->constantC == 1) && (this->constant_broadcast_type_C != -1)) {
    if (this->constant_broadcast_type_C == 0) {
      (*mb->_vptr_ModelBin[2])(&local_68,mb,1,0);
      if (&this->C_data != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar2 = (this->C_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->C_data).data;
            pAVar4 = (this->C_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).cstep = 0;
        *(undefined8 *)((long)&(this->C_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->C_data).elemsize + 4) = 0;
        (this->C_data).data = (void *)0x0;
        (this->C_data).refcount = (int *)0x0;
        (this->C_data).dims = 0;
        (this->C_data).w = 0;
        (this->C_data).h = 0;
        (this->C_data).d = 0;
        (this->C_data).c = 0;
        (this->C_data).data = local_68;
        (this->C_data).refcount = piStack_60;
        (this->C_data).elemsize = local_58;
        (this->C_data).elempack = local_50;
        (this->C_data).allocator = local_48;
        (this->C_data).dims = local_40;
        (this->C_data).w = iStack_3c;
        (this->C_data).h = iStack_38;
        (this->C_data).d = iStack_34;
        (this->C_data).c = local_30;
        (this->C_data).cstep = local_28;
      }
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + -1;
        UNLOCK();
        if (*piStack_60 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->constant_broadcast_type_C == 1) {
      (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->constantM,0);
      if (&this->C_data != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar2 = (this->C_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->C_data).data;
            pAVar4 = (this->C_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).cstep = 0;
        *(undefined8 *)((long)&(this->C_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->C_data).elemsize + 4) = 0;
        (this->C_data).data = (void *)0x0;
        (this->C_data).refcount = (int *)0x0;
        (this->C_data).dims = 0;
        (this->C_data).w = 0;
        (this->C_data).h = 0;
        (this->C_data).d = 0;
        (this->C_data).c = 0;
        (this->C_data).data = local_68;
        (this->C_data).refcount = piStack_60;
        (this->C_data).elemsize = local_58;
        (this->C_data).elempack = local_50;
        (this->C_data).allocator = local_48;
        (this->C_data).dims = local_40;
        (this->C_data).w = iStack_3c;
        (this->C_data).h = iStack_38;
        (this->C_data).d = iStack_34;
        (this->C_data).c = local_30;
        (this->C_data).cstep = local_28;
      }
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + -1;
        UNLOCK();
        if (*piStack_60 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->constant_broadcast_type_C == 2) {
      (*mb->_vptr_ModelBin[3])(&local_68,mb,1,(ulong)(uint)this->constantM,0);
      if (&this->C_data != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar2 = (this->C_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->C_data).data;
            pAVar4 = (this->C_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).cstep = 0;
        *(undefined8 *)((long)&(this->C_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->C_data).elemsize + 4) = 0;
        (this->C_data).data = (void *)0x0;
        (this->C_data).refcount = (int *)0x0;
        (this->C_data).dims = 0;
        (this->C_data).w = 0;
        (this->C_data).h = 0;
        (this->C_data).d = 0;
        (this->C_data).c = 0;
        (this->C_data).data = local_68;
        (this->C_data).refcount = piStack_60;
        (this->C_data).elemsize = local_58;
        (this->C_data).elempack = local_50;
        (this->C_data).allocator = local_48;
        (this->C_data).dims = local_40;
        (this->C_data).w = iStack_3c;
        (this->C_data).h = iStack_38;
        (this->C_data).d = iStack_34;
        (this->C_data).c = local_30;
        (this->C_data).cstep = local_28;
      }
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + -1;
        UNLOCK();
        if (*piStack_60 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->constant_broadcast_type_C == 3) {
      (*mb->_vptr_ModelBin[3])
                (&local_68,mb,(ulong)(uint)this->constantN,(ulong)(uint)this->constantM,0);
      if (&this->C_data != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar2 = (this->C_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->C_data).data;
            pAVar4 = (this->C_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).cstep = 0;
        *(undefined8 *)((long)&(this->C_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->C_data).elemsize + 4) = 0;
        (this->C_data).data = (void *)0x0;
        (this->C_data).refcount = (int *)0x0;
        (this->C_data).dims = 0;
        (this->C_data).w = 0;
        (this->C_data).h = 0;
        (this->C_data).d = 0;
        (this->C_data).c = 0;
        (this->C_data).data = local_68;
        (this->C_data).refcount = piStack_60;
        (this->C_data).elemsize = local_58;
        (this->C_data).elempack = local_50;
        (this->C_data).allocator = local_48;
        (this->C_data).dims = local_40;
        (this->C_data).w = iStack_3c;
        (this->C_data).h = iStack_38;
        (this->C_data).d = iStack_34;
        (this->C_data).c = local_30;
        (this->C_data).cstep = local_28;
      }
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + -1;
        UNLOCK();
        if (*piStack_60 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->constant_broadcast_type_C == 4) {
      (*mb->_vptr_ModelBin[3])(&local_68,mb,(ulong)(uint)this->constantN,1,0);
      if (&this->C_data != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar2 = (this->C_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->C_data).data;
            pAVar4 = (this->C_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).cstep = 0;
        *(undefined8 *)((long)&(this->C_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->C_data).elemsize + 4) = 0;
        (this->C_data).data = (void *)0x0;
        (this->C_data).refcount = (int *)0x0;
        (this->C_data).dims = 0;
        (this->C_data).w = 0;
        (this->C_data).h = 0;
        (this->C_data).d = 0;
        (this->C_data).c = 0;
        (this->C_data).data = local_68;
        (this->C_data).refcount = piStack_60;
        (this->C_data).elemsize = local_58;
        (this->C_data).elempack = local_50;
        (this->C_data).allocator = local_48;
        (this->C_data).dims = local_40;
        (this->C_data).w = iStack_3c;
        (this->C_data).h = iStack_38;
        (this->C_data).d = iStack_34;
        (this->C_data).c = local_30;
        (this->C_data).cstep = local_28;
      }
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + -1;
        UNLOCK();
        if (*piStack_60 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((this->C_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->C_data).c * (this->C_data).cstep == 0) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Gemm::load_model(const ModelBin& mb)
{
    if (constantA == 1)
    {
        if (transA == 0)
            A_data = mb.load(constantK, constantM, 0);
        else
            A_data = mb.load(constantM, constantK, 0);
        if (A_data.empty())
            return -100;
    }

    if (constantB == 1)
    {
        if (transB == 0)
            B_data = mb.load(constantN, constantK, 0);
        else
            B_data = mb.load(constantK, constantN, 0);
        if (B_data.empty())
            return -100;
    }

    if (constantC == 1 && constant_broadcast_type_C != -1)
    {
        if (constant_broadcast_type_C == 0)
            C_data = mb.load(1, 0);
        if (constant_broadcast_type_C == 1)
            C_data = mb.load(constantM, 0);
        if (constant_broadcast_type_C == 2)
            C_data = mb.load(1, constantM, 0);
        if (constant_broadcast_type_C == 3)
            C_data = mb.load(constantN, constantM, 0);
        if (constant_broadcast_type_C == 4)
            C_data = mb.load(constantN, 1, 0);
        if (C_data.empty())
            return -100;
    }

    return 0;
}